

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

http_parser * __thiscall cinatra::http_parser::operator=(http_parser *this,http_parser *param_2)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RSI;
  http_parser *in_RDI;
  
  in_RDI->status_ = *(int *)&(in_RSI->_M_h)._M_buckets;
  (in_RDI->msg_)._M_len = (in_RSI->_M_h)._M_bucket_count;
  (in_RDI->msg_)._M_str = (char *)(in_RSI->_M_h)._M_before_begin._M_nxt;
  memcpy(&in_RDI->num_headers_,&(in_RSI->_M_h)._M_element_count,0xca0);
  (in_RDI->method_)._M_len = in_RSI[0x3a]._M_h._M_bucket_count;
  (in_RDI->method_)._M_str = (char *)in_RSI[0x3a]._M_h._M_before_begin._M_nxt;
  (in_RDI->url_)._M_len = in_RSI[0x3a]._M_h._M_element_count;
  (in_RDI->url_)._M_str = *(char **)&in_RSI[0x3a]._M_h._M_rehash_policy;
  (in_RDI->full_url_)._M_len = in_RSI[0x3a]._M_h._M_rehash_policy._M_next_resize;
  (in_RDI->full_url_)._M_str = (char *)in_RSI[0x3a]._M_h._M_single_bucket;
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::operator=(in_RSI,(unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      *)in_RDI);
  return in_RDI;
}

Assistant:

void parse_body_len() {
    auto header_value = this->get_header_value("content-length"sv);
    if (header_value.empty()) {
      body_len_ = 0;
    }
    else {
      auto [ptr, ec] = std::from_chars(
          header_value.data(), header_value.data() + header_value.size(),
          body_len_, 10);
      if (ec != std::errc{}) {
        body_len_ = -1;
      }
    }
  }